

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

ecs_entity_t
ecs_type_contains(ecs_world_t *world,ecs_type_t type_1,ecs_type_t type_2,_Bool match_all,
                 _Bool match_prefab)

{
  ulong component;
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  void *pvVar4;
  ulong *puVar5;
  ecs_entity_t eVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong unaff_R12;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ecs_world_t *local_60;
  void *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong local_40;
  ecs_type_t local_38;
  
  local_60 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
              ,0x3b);
  if (local_60 == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x3b,
                  "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                 );
  }
  ecs_get_stage(&local_60);
  if (type_1 == (ecs_type_t)0x0) {
    uVar11 = 0;
  }
  else {
    _ecs_assert(type_2 != (ecs_type_t)0x0,0xc,(char *)0x0,"type_2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                ,0x42);
    if (type_2 == (ecs_type_t)0x0) {
      __assert_fail("type_2 != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                    ,0x42,
                    "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                   );
    }
    local_50 = (ulong *)_ecs_vector_first(type_1,8,0x10);
    if (type_1 == type_2) {
      uVar11 = *local_50;
    }
    else {
      pvVar4 = _ecs_vector_first(type_2,8,0x10);
      _ecs_assert(local_50 != (ulong *)0x0,0xc,(char *)0x0,"t1_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4d);
      if (local_50 == (ulong *)0x0) {
        __assert_fail("t1_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4d,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"t2_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4e);
      local_58 = pvVar4;
      if (pvVar4 == (void *)0x0) {
        __assert_fail("t2_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4e,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      iVar2 = ecs_vector_count(type_1);
      uVar3 = ecs_vector_count(type_2);
      iVar9 = 0;
      if ((int)uVar3 < 1) {
        uVar7 = 0;
      }
      else {
        local_40 = (ulong)uVar3;
        local_48 = local_50 + 1;
        uVar11 = 0;
        uVar7 = 0;
        puVar8 = local_50;
        pvVar4 = local_58;
        local_38 = type_1;
        do {
          iVar10 = iVar9;
          if (iVar9 < iVar2) {
            component = *(ulong *)((long)pvVar4 + uVar11 * 8);
            uVar7 = puVar8[iVar9];
            if (uVar7 < component) {
              iVar10 = iVar9 + 1;
              if (iVar10 < iVar2) {
                puVar5 = local_48 + iVar9;
                do {
                  uVar7 = *puVar5;
                  if (component <= uVar7) goto LAB_00128e70;
                  iVar10 = iVar10 + 1;
                  puVar5 = puVar5 + 1;
                } while (iVar2 != iVar10);
              }
              goto LAB_00128f08;
            }
LAB_00128e70:
            if (uVar7 == component) {
              if (match_all) {
                iVar10 = iVar10 + 1;
                if (iVar10 < iVar2) {
                  uVar7 = puVar8[iVar10];
                }
                goto LAB_00128f1f;
              }
LAB_00128efd:
              bVar1 = false;
              unaff_R12 = uVar7;
              iVar9 = iVar10;
            }
            else {
              if ((((match_prefab) && (component != 6)) && (component != 0x101)) &&
                 ((component != 0x103 &&
                  (eVar6 = ecs_find_entity_in_prefabs(local_60,0,local_38,component,0),
                  puVar8 = local_50, pvVar4 = local_58, eVar6 != 0)))) {
                uVar7 = component;
              }
              if (uVar7 == component) {
                if (!match_all) goto LAB_00128efd;
              }
              else if (match_all) goto LAB_00128f08;
LAB_00128f1f:
              bVar1 = true;
              iVar9 = iVar10;
            }
          }
          else {
LAB_00128f08:
            bVar1 = false;
            unaff_R12 = 0;
            iVar9 = iVar10;
          }
          if (!bVar1) {
            return unaff_R12;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != local_40);
      }
      uVar11 = 0;
      if (match_all) {
        uVar11 = uVar7;
      }
    }
  }
  return uVar11;
}

Assistant:

ecs_entity_t ecs_type_contains(
    ecs_world_t *world,
    ecs_type_t type_1,
    ecs_type_t type_2,
    bool match_all,
    bool match_prefab)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_get_stage(&world);
    
    if (!type_1) {
        return 0;
    }

    ecs_assert(type_2 != NULL, ECS_INTERNAL_ERROR, NULL);

    if (type_1 == type_2) {
        return *(ecs_vector_first(type_1, ecs_entity_t));
    }

    int32_t i_2, i_1 = 0;
    ecs_entity_t e1 = 0;
    ecs_entity_t *t1_array = ecs_vector_first(type_1, ecs_entity_t);
    ecs_entity_t *t2_array = ecs_vector_first(type_2, ecs_entity_t);

    ecs_assert(t1_array != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(t2_array != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t t1_count = ecs_vector_count(type_1);
    int32_t t2_count = ecs_vector_count(type_2);

    for (i_2 = 0; i_2 < t2_count; i_2 ++) {
        ecs_entity_t e2 = t2_array[i_2];

        if (i_1 >= t1_count) {
            return 0;
        }

        e1 = t1_array[i_1];

        if (e2 > e1) {
            do {
                i_1 ++;
                if (i_1 >= t1_count) {
                    return 0;
                }
                e1 = t1_array[i_1];
            } while (e2 > e1);
        }

        if (e1 != e2) {
            if (match_prefab && e2 != 
                ecs_typeid(EcsName) && e2 != 
                EcsPrefab && e2 != 
                EcsDisabled) 
            {
                if (ecs_find_entity_in_prefabs(world, 0, type_1, e2, 0)) {
                    e1 = e2;
                }
            }

            if (e1 != e2) {
                if (match_all) return 0;
            } else if (!match_all) {
                return e1;
            }
        } else {
            if (!match_all) return e1;
            i_1 ++;
            if (i_1 < t1_count) {
                e1 = t1_array[i_1];
            }
        }
    }

    if (match_all) {
        return e1;
    } else {
        return 0;
    }
}